

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::hover(QMainWindowLayout *this,QLayoutItem *hoverTarget,QPoint *mousePos)

{
  bool bVar1;
  compare_eq_result_container<QList<int>,_int> cVar2;
  int iVar3;
  Int IVar4;
  DockWidgetArea DVar5;
  int iVar6;
  int iVar7;
  QWidget *pQVar8;
  undefined4 extraout_var;
  QDockWidget *pQVar9;
  QDockWidgetGroupWindow *pQVar10;
  QScreen *pQVar11;
  QScreen *pQVar12;
  QRect *pQVar13;
  ulong uVar14;
  QWidget *pQVar15;
  QTabBar *pQVar16;
  QLoggingCategory *pQVar17;
  QDebug *pQVar18;
  bool in_DL;
  QMainWindowLayoutState *in_RSI;
  QMainWindowLayoutState *pQVar19;
  long in_RDI;
  long in_FS_OFFSET;
  QToolBar *tb;
  bool allowed;
  QDockWidgetGroupWindow *groupWindow;
  QDockAreaLayoutInfo *parentInfo;
  DockPosition dockPosition;
  Shape shape;
  QDockAreaLayoutInfo *info;
  QDockWidgetGroupWindow *floatingTabs;
  QDockWidget *dropTo;
  QScreen *screen2;
  QScreen *screen1;
  QWidget *w_1;
  iterator __end2_1;
  iterator __begin2_1;
  QVarLengthArray<QWidget_*,_10LL> *__range2_1;
  QDockWidget *dw;
  QObject *c_1;
  QObjectList *__range4;
  QDockWidgetGroupWindow *group;
  QObject *c;
  QObjectList *__range2;
  QWidget *widget;
  QSize size;
  QSize min;
  QList<int> path;
  QPoint pos;
  const_iterator __end4;
  const_iterator __begin4;
  QObjectList groupChildren;
  QWidget *w;
  const_iterator __end2;
  const_iterator __begin2;
  QObjectList siblings;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QMainWindowLayoutState newState;
  QVarLengthArray<QWidget_*,_10LL> candidates;
  undefined4 in_stack_fffffffffffff918;
  ToolBarArea in_stack_fffffffffffff91c;
  QMainWindowLayout *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  QWidget *in_stack_fffffffffffff930;
  QWidget *in_stack_fffffffffffff938;
  QMainWindowLayout *in_stack_fffffffffffff940;
  QMainWindowLayoutState *in_stack_fffffffffffff948;
  QMainWindowLayout *in_stack_fffffffffffff950;
  DockPosition in_stack_fffffffffffff958;
  Shape in_stack_fffffffffffff95c;
  QMainWindowLayout *in_stack_fffffffffffff960;
  undefined6 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96e;
  undefined1 uVar20;
  QMainWindowLayoutState *in_stack_fffffffffffff978;
  uint in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  QMainWindowLayout *mousePos_00;
  QLayoutItem *in_stack_fffffffffffff990;
  DockPosition in_stack_fffffffffffff998;
  Shape in_stack_fffffffffffff99c;
  QMainWindowLayout *in_stack_fffffffffffff9a0;
  QDockWidgetGroupWindow *in_stack_fffffffffffff9d8;
  QRegion local_5c8;
  QRect local_5c0;
  QSize local_5b0;
  QSize local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  QPoint local_588;
  QPoint local_580;
  QDebug local_558;
  QDebug local_550;
  QDebug local_548 [5];
  QDebug local_520;
  QLoggingCategory local_518 [2];
  QDebug local_4e8;
  QDebug local_4e0;
  QDebug local_4d8;
  QDebug local_4d0;
  QDebug local_4c8;
  QWidget *local_4c0;
  QObject **local_4b8;
  const_iterator local_4b0;
  const_iterator local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  QWidget *local_488;
  QObject **local_480;
  const_iterator local_478;
  const_iterator local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_44c;
  undefined1 *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  undefined1 local_3a8 [824];
  QVarLengthArray<QWidget_*,_10LL> local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar19 = in_RSI;
  QLayout::parentWidget((QLayout *)in_stack_fffffffffffff930);
  iVar6 = (int)pQVar19;
  bVar1 = QWidget::isVisible((QWidget *)0x5fbf2e);
  if (!bVar1) goto LAB_005fcfa8;
  pQVar8 = QLayout::parentWidget((QLayout *)in_stack_fffffffffffff930);
  bVar1 = QWidget::isMinimized(pQVar8);
  if (((bVar1) || (*(long *)(in_RDI + 0x7d8) != 0)) || (in_RSI == (QMainWindowLayoutState *)0x0))
  goto LAB_005fcfa8;
  iVar3 = (*(*(_func_int ***)&in_RSI->rect)[0xd])();
  pQVar8 = (QWidget *)CONCAT44(extraout_var,iVar3);
  QWidget::raise(pQVar8,iVar6);
  local_44c.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)
       QFlags<QMainWindow::DockOption>::operator&
                 ((QFlags<QMainWindow::DockOption> *)in_stack_fffffffffffff920,
                  in_stack_fffffffffffff91c);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44c);
  uVar20 = false;
  if (IVar4 != 0) {
    pQVar9 = qobject_cast<QDockWidget*>((QObject *)0x5fbfd0);
    in_stack_fffffffffffff96e = true;
    uVar20 = in_stack_fffffffffffff96e;
    if (pQVar9 == (QDockWidget *)0x0) {
      pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5fbfec);
      in_stack_fffffffffffff96e = pQVar10 != (QDockWidgetGroupWindow *)0x0;
      uVar20 = in_stack_fffffffffffff96e;
    }
  }
  if ((bool)uVar20 != false) {
    memset(&local_70,0xaa,0x68);
    QVarLengthArray<QWidget_*,_10LL>::QVarLengthArray(&local_70);
    local_468 = &DAT_aaaaaaaaaaaaaaaa;
    local_460 = &DAT_aaaaaaaaaaaaaaaa;
    local_458 = &DAT_aaaaaaaaaaaaaaaa;
    QLayout::parentWidget((QLayout *)in_stack_fffffffffffff930);
    QObject::children((QObject *)0x5fc06f);
    QList<QObject_*>::QList
              ((QList<QObject_*> *)in_stack_fffffffffffff920,
               (QList<QObject_*> *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    local_470.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_470 = QList<QObject_*>::begin((QList<QObject_*> *)in_stack_fffffffffffff920);
    local_478.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_478 = QList<QObject_*>::end((QList<QObject_*> *)in_stack_fffffffffffff920);
    while( true ) {
      local_480 = local_478.i;
      bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_470,local_478);
      if (!bVar1) break;
      QList<QObject_*>::const_iterator::operator*(&local_470);
      local_488 = qobject_cast<QWidget*>
                            ((QObject *)
                             CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      if ((local_488 != (QWidget *)0x0) &&
         ((pQVar9 = qobject_cast<QDockWidget*>((QObject *)0x5fc161), pQVar9 != (QDockWidget *)0x0 ||
          (pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5fc174),
          pQVar10 != (QDockWidgetGroupWindow *)0x0)))) {
        if ((local_488 != pQVar8) &&
           (((bVar1 = QWidget::isWindow((QWidget *)in_stack_fffffffffffff920), bVar1 &&
             (bVar1 = QWidget::isVisible((QWidget *)0x5fc1b1), bVar1)) &&
            (bVar1 = QWidget::isMinimized(local_488), !bVar1)))) {
          QVarLengthArray<QWidget_*,_10LL>::operator<<
                    ((QVarLengthArray<QWidget_*,_10LL> *)in_stack_fffffffffffff920,
                     (QWidget **)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
        }
        pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5fc1ea);
        if (pQVar10 != (QDockWidgetGroupWindow *)0x0) {
          local_4a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_498 = &DAT_aaaaaaaaaaaaaaaa;
          local_490 = &DAT_aaaaaaaaaaaaaaaa;
          QObject::children((QObject *)0x5fc23b);
          QList<QObject_*>::QList
                    ((QList<QObject_*> *)in_stack_fffffffffffff920,
                     (QList<QObject_*> *)
                     CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
          local_4a8.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
          local_4a8 = QList<QObject_*>::begin((QList<QObject_*> *)in_stack_fffffffffffff920);
          local_4b0.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
          local_4b0 = QList<QObject_*>::end((QList<QObject_*> *)in_stack_fffffffffffff920);
          while( true ) {
            local_4b8 = local_4b0.i;
            bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_4a8,local_4b0);
            if (!bVar1) break;
            QList<QObject_*>::const_iterator::operator*(&local_4a8);
            pQVar15 = &qobject_cast<QDockWidget*>((QObject *)0x5fc308)->super_QWidget;
            if (((pQVar15 != (QWidget *)0x0) && (pQVar15 != pQVar8)) &&
               ((bVar1 = QDockWidget::isFloating((QDockWidget *)0x5fc33a), bVar1 &&
                ((bVar1 = QWidget::isVisible((QWidget *)0x5fc34d), bVar1 &&
                 (bVar1 = QWidget::isMinimized(pQVar15), !bVar1)))))) {
              local_4c0 = pQVar15;
              QVarLengthArray<QWidget_*,_10LL>::operator<<
                        ((QVarLengthArray<QWidget_*,_10LL> *)in_stack_fffffffffffff920,
                         (QWidget **)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
            }
            QList<QObject_*>::const_iterator::operator++(&local_4a8);
          }
          QList<QObject_*>::~QList((QList<QObject_*> *)0x5fc3ac);
        }
      }
      QList<QObject_*>::const_iterator::operator++(&local_470);
    }
    in_stack_fffffffffffff9d8 =
         (QDockWidgetGroupWindow *)QVLABase<QWidget_*>::begin((QVLABase<QWidget_*> *)0x5fc3ef);
    pQVar10 = (QDockWidgetGroupWindow *)
              QVLABase<QWidget_*>::end((QVLABase<QWidget_*> *)in_stack_fffffffffffff920);
LAB_005fc40c:
    if (in_stack_fffffffffffff9d8 == pQVar10) {
      iVar6 = 0;
    }
    else {
      pQVar15 = *(QWidget **)&in_stack_fffffffffffff9d8->super_QWidget;
      qt_widget_private((QWidget *)0x5fc442);
      pQVar11 = QWidgetPrivate::associatedScreen
                          ((QWidgetPrivate *)
                           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      qt_widget_private((QWidget *)0x5fc45f);
      pQVar12 = QWidgetPrivate::associatedScreen
                          ((QWidgetPrivate *)
                           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      if (((pQVar11 != (QScreen *)0x0) && (pQVar12 != (QScreen *)0x0)) && (pQVar11 != pQVar12))
      goto LAB_005fcaf0;
      pQVar13 = QWidget::geometry(pQVar15);
      uVar14 = QRect::contains((QPoint *)pQVar13,in_DL);
      if ((uVar14 & 1) == 0) goto LAB_005fcaf0;
      pQVar15 = &qobject_cast<QDockWidget*>((QObject *)0x5fc4d1)->super_QWidget;
      if (pQVar15 != (QWidget *)0x0) {
        QDockWidget::widget((QDockWidget *)in_stack_fffffffffffff920);
        pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5fc50a);
        if (pQVar10 == (QDockWidgetGroupWindow *)0x0) {
          in_stack_fffffffffffff960 =
               (QMainWindowLayout *)createTabbedDockWindow(in_stack_fffffffffffff940);
          QWidget::geometry(pQVar15);
          QWidget::setGeometry
                    ((QWidget *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                     (QRect *)in_stack_fffffffffffff950);
          in_stack_fffffffffffff9a0 =
               (QMainWindowLayout *)
               QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fc55a);
          in_stack_fffffffffffff95c =
               tabwidgetPositionToTabBarShape((QWidget *)in_stack_fffffffffffff920);
          DVar5 = dockWidgetArea((QMainWindowLayout *)
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                 (QWidget *)in_stack_fffffffffffff920);
          in_stack_fffffffffffff958 = toDockPos(DVar5);
          if (in_stack_fffffffffffff958 == DockCount) {
            DVar5 = dockWidgetArea((QMainWindowLayout *)
                                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                   (QWidget *)in_stack_fffffffffffff920);
            in_stack_fffffffffffff958 = toDockPos(DVar5);
          }
          if (in_stack_fffffffffffff958 == DockCount) {
            in_stack_fffffffffffff958 = RightDock;
          }
          in_stack_fffffffffffff950 = (QMainWindowLayout *)(in_RDI + 0x3a0);
          in_stack_fffffffffffff998 = in_stack_fffffffffffff958;
          in_stack_fffffffffffff99c = in_stack_fffffffffffff95c;
          QLayout::parentWidget((QLayout *)in_stack_fffffffffffff930);
          QDockAreaLayoutInfo::QDockAreaLayoutInfo
                    ((QDockAreaLayoutInfo *)in_stack_fffffffffffff940,
                     (int *)in_stack_fffffffffffff938,
                     (DockPosition)((ulong)in_stack_fffffffffffff930 >> 0x20),
                     (Orientation)in_stack_fffffffffffff930,in_stack_fffffffffffff92c,
                     (QMainWindow *)in_stack_fffffffffffff920);
          QDockAreaLayoutInfo::operator=
                    ((QDockAreaLayoutInfo *)in_stack_fffffffffffff920,
                     (QDockAreaLayoutInfo *)
                     CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
          QDockAreaLayoutInfo::~QDockAreaLayoutInfo
                    ((QDockAreaLayoutInfo *)in_stack_fffffffffffff920);
          pQVar16 = getTabBar(in_stack_fffffffffffff950);
          (in_stack_fffffffffffff9a0->super_QMainWindowLayoutSeparatorHelper<QMainWindowLayout>).
          movingSeparator.d.ptr = (int *)pQVar16;
          *(bool *)&(in_stack_fffffffffffff9a0->
                    super_QMainWindowLayoutSeparatorHelper<QMainWindowLayout>).movingSeparator.d.d =
               true;
          QDockAreaLayoutInfo::add
                    ((QDockAreaLayoutInfo *)in_stack_fffffffffffff960,
                     (QWidget *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          in_stack_fffffffffffff990 =
               (QLayoutItem *)(in_RDI + 0x1e0 + (ulong)in_stack_fffffffffffff998 * 0x70);
          QDockAreaLayoutInfo::add
                    ((QDockAreaLayoutInfo *)in_stack_fffffffffffff960,
                     (QWidget *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          QWidget::setParent((QWidget *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
          local_428 = &DAT_aaaaaaaaaaaaaaaa;
          local_420 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcQpaDockWidgets();
          anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffff920,
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_428), bVar1) {
            anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5fc742);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffff930,
                       (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                       (int)((ulong)in_stack_fffffffffffff920 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                       (char *)0x5fc75b);
            QMessageLogger::debug();
            pQVar18 = QDebug::operator<<((QDebug *)in_stack_fffffffffffff938,
                                         (char *)CONCAT17(uVar20,CONCAT16(in_stack_fffffffffffff96e,
                                                                          in_stack_fffffffffffff968)
                                                         ));
            QDebug::QDebug(&local_4e0,pQVar18);
            ::operator<<((QDebug *)in_stack_fffffffffffff9a0,
                         (QWidget *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
            pQVar18 = QDebug::operator<<((QDebug *)in_stack_fffffffffffff938,
                                         (char *)CONCAT17(uVar20,CONCAT16(in_stack_fffffffffffff96e,
                                                                          in_stack_fffffffffffff968)
                                                         ));
            QDebug::QDebug(&local_4d0,pQVar18);
            ::operator<<((QDebug *)in_stack_fffffffffffff9a0,
                         (QWidget *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
            QDebug::~QDebug(&local_4c8);
            QDebug::~QDebug(&local_4d0);
            QDebug::~QDebug(&local_4d8);
            QDebug::~QDebug(&local_4e0);
            QDebug::~QDebug(&local_4e8);
            local_420 = (undefined1 *)((ulong)local_420 & 0xffffffffffffff00);
          }
        }
        QWidget::show(in_stack_fffffffffffff930);
        local_438 = &DAT_aaaaaaaaaaaaaaaa;
        local_430 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar17 = QtPrivateLogging::lcQpaDockWidgets();
        anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffff920,
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                  );
        while( true ) {
          iVar6 = (int)pQVar17;
          bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_438);
          if (!bVar1) break;
          anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5fc8b3);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff930,
                     (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (int)((ulong)in_stack_fffffffffffff920 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                     (char *)0x5fc8cc);
          QMessageLogger::debug();
          pQVar18 = QDebug::operator<<((QDebug *)in_stack_fffffffffffff938,
                                       (char *)CONCAT17(uVar20,CONCAT16(in_stack_fffffffffffff96e,
                                                                        in_stack_fffffffffffff968)))
          ;
          QDebug::QDebug((QDebug *)local_518,pQVar18);
          pQVar17 = local_518;
          ::operator<<((QDebug *)in_stack_fffffffffffff950,(QDockWidget *)in_stack_fffffffffffff948)
          ;
          QDebug::~QDebug((QDebug *)&local_518[0].name);
          QDebug::~QDebug((QDebug *)local_518);
          QDebug::~QDebug(&local_520);
          local_430 = (undefined1 *)((ulong)local_430 & 0xffffffffffffff00);
        }
        QWidget::raise(pQVar8,iVar6);
        local_448 = &DAT_aaaaaaaaaaaaaaaa;
        local_440 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcQpaDockWidgets();
        anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffff920,
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_448), bVar1) {
          anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5fc9b9);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff930,
                     (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (int)((ulong)in_stack_fffffffffffff920 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                     (char *)0x5fc9d2);
          QMessageLogger::debug();
          pQVar18 = QDebug::operator<<((QDebug *)in_stack_fffffffffffff938,
                                       (char *)CONCAT17(uVar20,CONCAT16(in_stack_fffffffffffff96e,
                                                                        in_stack_fffffffffffff968)))
          ;
          QDebug::QDebug(&local_550,pQVar18);
          ::operator<<((QDebug *)in_stack_fffffffffffff9a0,
                       (QWidget *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
          QDebug::~QDebug(local_548);
          QDebug::~QDebug(&local_550);
          QDebug::~QDebug(&local_558);
          local_440 = (undefined1 *)((ulong)local_440 & 0xffffffffffffff00);
        }
      }
      in_stack_fffffffffffff940 =
           (QMainWindowLayout *)qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5fca6b);
      in_stack_fffffffffffff948 = in_RSI;
      mousePos_00 = in_stack_fffffffffffff940;
      local_580 = QWidget::mapFromGlobal
                            (in_stack_fffffffffffff930,
                             (QPoint *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)
                            );
      bVar1 = QDockWidgetGroupWindow::hover
                        ((QDockWidgetGroupWindow *)
                         CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                         in_stack_fffffffffffff990,(QPoint *)mousePos_00);
      if (bVar1) {
        setCurrentHoveredFloat(in_stack_fffffffffffff9a0,in_stack_fffffffffffff9d8);
        applyState((QMainWindowLayout *)
                   CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                   in_stack_fffffffffffff978,SUB81((ulong)in_RDI >> 0x38,0));
      }
      iVar6 = 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x5fcb1e);
    QVarLengthArray<QWidget_*,_10LL>::~QVarLengthArray
              ((QVarLengthArray<QWidget_*,_10LL> *)in_stack_fffffffffffff920);
    if (iVar6 != 0) goto LAB_005fcfa8;
    in_stack_fffffffffffff984 = 0;
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5fcb4d);
  if (bVar1) {
    QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fcb64);
    QDockWidgetGroupWindow::destroyIfSingleItemLeft
              ((QDockWidgetGroupWindow *)
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
  }
  setCurrentHoveredFloat(in_stack_fffffffffffff9a0,in_stack_fffffffffffff9d8);
  *(undefined1 *)(in_RDI + 0x3a4) = 0;
  local_588 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QLayout::parentWidget((QLayout *)in_stack_fffffffffffff930);
  local_588 = QWidget::mapFromGlobal
                        (in_stack_fffffffffffff930,
                         (QPoint *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5fcbc3);
  if (!bVar1) {
    QMainWindowLayoutState::operator=
              ((QMainWindowLayoutState *)in_stack_fffffffffffff920,
               (QMainWindowLayoutState *)
               CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
  }
  local_5a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_598 = &DAT_aaaaaaaaaaaaaaaa;
  local_590 = &DAT_aaaaaaaaaaaaaaaa;
  QMainWindowLayoutState::gapIndex
            ((QMainWindowLayoutState *)in_stack_fffffffffffff950,
             (QWidget *)in_stack_fffffffffffff948,(QPoint *)in_stack_fffffffffffff940);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x5fcc45);
  if (!bVar1) {
    in_stack_fffffffffffff980 = in_stack_fffffffffffff980 & 0xffffff;
    bVar1 = isAreaAllowed((QWidget *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                          (QList<int> *)in_stack_fffffffffffff950);
    in_stack_fffffffffffff980 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff980);
    in_stack_fffffffffffff978 =
         (QMainWindowLayoutState *)qobject_cast<QToolBar*>((QObject *)0x5fcc7a);
    if (in_stack_fffffffffffff978 != (QMainWindowLayoutState *)0x0) {
      QList<int>::at((QList<int> *)in_stack_fffffffffffff920,
                     CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      toToolBarArea(0);
      bVar1 = QToolBar::isAreaAllowed
                        ((QToolBar *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c);
      in_stack_fffffffffffff980 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff980);
    }
    if ((in_stack_fffffffffffff980 & 0x1000000) == 0) {
      QList<int>::clear((QList<int> *)in_stack_fffffffffffff920);
    }
  }
  cVar2 = QList<int>::operator==
                    ((QList<int> *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                     (QList<int> *)in_stack_fffffffffffff950);
  if (!cVar2) {
    QList<int>::operator=
              ((QList<int> *)in_stack_fffffffffffff920,
               (QList<int> *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    bVar1 = QList<int>::isEmpty((QList<int> *)0x5fcd24);
    if (bVar1) {
      fixToolBarOrientation((QLayoutItem *)in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
      restore(in_stack_fffffffffffff920,SUB41(in_stack_fffffffffffff91c >> 0x18,0));
    }
    else {
      QList<int>::at((QList<int> *)in_stack_fffffffffffff920,
                     CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      fixToolBarOrientation((QLayoutItem *)in_RSI,in_stack_fffffffffffff92c);
      memset(local_3a8,0xaa,0x338);
      QMainWindowLayoutState::QMainWindowLayoutState
                ((QMainWindowLayoutState *)in_stack_fffffffffffff920,
                 (QMainWindowLayoutState *)
                 CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      bVar1 = QMainWindowLayoutState::insertGap
                        ((QMainWindowLayoutState *)in_stack_fffffffffffff950,
                         (QList<int> *)in_stack_fffffffffffff948,
                         (QLayoutItem *)in_stack_fffffffffffff940);
      if (bVar1) {
        local_5a8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_5a8 = QMainWindowLayoutState::minimumSize(in_RSI);
        local_5b0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_5b0 = QRect::size(&in_RSI->rect);
        iVar6 = QSize::width((QSize *)0x5fce49);
        iVar3 = QSize::width((QSize *)0x5fce5a);
        if (iVar6 <= iVar3) {
          iVar3 = QSize::height((QSize *)0x5fce71);
          iVar7 = QSize::height((QSize *)0x5fce82);
          if (iVar3 <= iVar7) {
            QMainWindowLayoutState::fitLayout
                      ((QMainWindowLayoutState *)
                       CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
            local_5c0 = QMainWindowLayoutState::gapRect
                                  (in_stack_fffffffffffff948,(QList<int> *)in_stack_fffffffffffff940
                                  );
            *(undefined8 *)(in_RDI + 0x7c8) = local_5c0._0_8_;
            *(undefined8 *)(in_RDI + 2000) = local_5c0._8_8_;
            in_stack_fffffffffffff920 =
                 (QMainWindowLayout *)QLayout::parentWidget((QLayout *)in_RSI);
            uVar20 = (undefined1)((ulong)in_RDI >> 0x38);
            QDockAreaLayout::separatorRegion((QDockAreaLayout *)in_stack_fffffffffffff940);
            QWidget::update((QWidget *)in_RSI,(QRegion *)CONCAT44(iVar6,iVar3));
            QRegion::~QRegion(&local_5c8);
            QMainWindowLayoutState::operator=
                      ((QMainWindowLayoutState *)in_stack_fffffffffffff920,
                       (QMainWindowLayoutState *)
                       CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
            applyState((QMainWindowLayout *)
                       CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                       in_stack_fffffffffffff978,(bool)uVar20);
            updateGapIndicator(in_stack_fffffffffffff960);
            goto LAB_005fcf8e;
          }
        }
        restore(in_stack_fffffffffffff920,SUB41(in_stack_fffffffffffff91c >> 0x18,0));
      }
      else {
        restore(in_stack_fffffffffffff920,SUB41(in_stack_fffffffffffff91c >> 0x18,0));
      }
LAB_005fcf8e:
      QMainWindowLayoutState::~QMainWindowLayoutState
                ((QMainWindowLayoutState *)in_stack_fffffffffffff920);
    }
  }
  QList<int>::~QList((QList<int> *)0x5fcfa8);
LAB_005fcfa8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
LAB_005fcaf0:
  in_stack_fffffffffffff9d8 =
       (QDockWidgetGroupWindow *)&(in_stack_fffffffffffff9d8->super_QWidget).field_0x8;
  goto LAB_005fc40c;
}

Assistant:

void QMainWindowLayout::hover(QLayoutItem *hoverTarget,
                              const QPoint &mousePos) {
  if (!parentWidget()->isVisible() || parentWidget()->isMinimized() ||
      pluggingWidget != nullptr || hoverTarget == nullptr)
    return;

  QWidget *widget = hoverTarget->widget();

#if QT_CONFIG(dockwidget)
    widget->raise();
    if ((dockOptions & QMainWindow::GroupedDragging) && (qobject_cast<QDockWidget*>(widget)
            || qobject_cast<QDockWidgetGroupWindow *>(widget))) {

        // Check if we are over another floating dock widget
        QVarLengthArray<QWidget *, 10> candidates;
        const auto siblings = parentWidget()->children();
        for (QObject *c : siblings) {
            QWidget *w = qobject_cast<QWidget*>(c);
            if (!w)
                continue;

            // Handle only dock widgets and group windows
            if (!qobject_cast<QDockWidget*>(w) && !qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;

            // Check permission to dock on another dock widget or floating dock
            // FIXME in Qt 7

            if (w != widget && w->isWindow() && w->isVisible() && !w->isMinimized())
                candidates << w;

            if (QDockWidgetGroupWindow *group = qobject_cast<QDockWidgetGroupWindow *>(w)) {
                // floating QDockWidgets have a QDockWidgetGroupWindow as a parent,
                // if they have been hovered over
                const auto groupChildren = group->children();
                for (QObject *c : groupChildren) {
                    if (QDockWidget *dw = qobject_cast<QDockWidget*>(c)) {
                        if (dw != widget && dw->isFloating() && dw->isVisible() && !dw->isMinimized())
                            candidates << dw;
                    }
                }
            }
        }

        for (QWidget *w : candidates) {
            const QScreen *screen1 = qt_widget_private(widget)->associatedScreen();
            const QScreen *screen2 = qt_widget_private(w)->associatedScreen();
            if (screen1 && screen2 && screen1 != screen2)
                continue;
            if (!w->geometry().contains(mousePos))
                continue;

#if QT_CONFIG(tabwidget)
            if (auto dropTo = qobject_cast<QDockWidget *>(w)) {

                // w is the drop target's widget
                w = dropTo->widget();

                // Create a floating tab, unless already existing
                if (!qobject_cast<QDockWidgetGroupWindow *>(w)) {
                    QDockWidgetGroupWindow *floatingTabs = createTabbedDockWindow();
                    floatingTabs->setGeometry(dropTo->geometry());
                    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
                    const QTabBar::Shape shape = tabwidgetPositionToTabBarShape(dropTo);

                    // dropTo and widget may be in a state where they transition
                    // from being a group window child to a single floating dock widget.
                    // In that case, their path to a main window dock may not have been
                    // updated yet.
                    // => ask both and fall back to dock 1 (right dock)
                    QInternal::DockPosition dockPosition = toDockPos(dockWidgetArea(dropTo));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = toDockPos(dockWidgetArea(widget));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = QInternal::DockPosition::RightDock;

                    *info = QDockAreaLayoutInfo(&layoutState.dockAreaLayout.sep, dockPosition,
                                                Qt::Horizontal, shape,
                                                static_cast<QMainWindow *>(parentWidget()));
                    info->tabBar = getTabBar();
                    info->tabbed = true;
                    info->add(dropTo);
                    QDockAreaLayoutInfo &parentInfo = layoutState.dockAreaLayout.docks[dockPosition];
                    parentInfo.add(floatingTabs);
                    dropTo->setParent(floatingTabs);
                    qCDebug(lcQpaDockWidgets) << "Wrapping" << widget << "into floating tabs" << floatingTabs;
                    w = floatingTabs;
                }

                // Show the drop target and raise widget to foreground
                dropTo->show();
                qCDebug(lcQpaDockWidgets) << "Showing" << dropTo;
                widget->raise();
                qCDebug(lcQpaDockWidgets) << "Raising" << widget;
            }
#endif
            auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(w);
            Q_ASSERT(groupWindow);
            if (groupWindow->hover(hoverTarget, groupWindow->mapFromGlobal(mousePos))) {
                setCurrentHoveredFloat(groupWindow);
                applyState(layoutState); // update the tabbars
            }
            return;
        }
    }

    // If a temporary group window has been created during a hover,
    // remove it, if it has only one dockwidget child
    if (currentHoveredFloat)
        currentHoveredFloat->destroyIfSingleItemLeft();

    setCurrentHoveredFloat(nullptr);
    layoutState.dockAreaLayout.fallbackToSizeHints = false;
#endif // QT_CONFIG(dockwidget)

    QPoint pos = parentWidget()->mapFromGlobal(mousePos);

    if (!savedState.isValid())
        savedState = layoutState;

    QList<int> path = savedState.gapIndex(widget, pos);

    if (!path.isEmpty()) {
        bool allowed = false;

#if QT_CONFIG(dockwidget)
        allowed = isAreaAllowed(widget, path);
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            allowed = tb->isAreaAllowed(toToolBarArea(path.at(1)));
#endif

        if (!allowed)
            path.clear();
    }

    if (path == currentGapPos)
        return; // the gap is already there

    currentGapPos = path;
    if (path.isEmpty()) {
        fixToolBarOrientation(hoverTarget, 2); // 2 = top dock, ie. horizontal
        restore(true);
        return;
    }

    fixToolBarOrientation(hoverTarget, currentGapPos.at(1));

    QMainWindowLayoutState newState = savedState;

    if (!newState.insertGap(path, hoverTarget)) {
        restore(true); // not enough space
        return;
    }

    QSize min = newState.minimumSize();
    QSize size = newState.rect.size();

    if (min.width() > size.width() || min.height() > size.height()) {
        restore(true);
        return;
    }

    newState.fitLayout();

    currentGapRect = newState.gapRect(currentGapPos);

#if QT_CONFIG(dockwidget)
    parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#endif
    layoutState = std::move(newState);
    applyState(layoutState);

    updateGapIndicator();
}